

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferRangeCase::
ModifyAfterWithMapBufferRangeCase
          (ModifyAfterWithMapBufferRangeCase *this,Context *context,char *name,char *desc,
          int bufferSizeMin,int bufferSizeMax,deUint32 usage,int flags,deUint32 glMapFlags)

{
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  deUint64 dVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  uint uVar7;
  value_type *__val;
  pointer pUVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  float fVar15;
  allocator_type local_3d;
  deUint32 local_3c;
  int local_38;
  float local_34;
  
  gles3::TestCase::TestCase((TestCase *)this,context,NODETYPE_PERFORMANCE,name,desc);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_01e42630;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_dummyProgram = (ShaderProgram *)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_dummyProgramPosLoc = -1;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_bufferID = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_numSamples = 0x14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_bufferSizeMin = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_bufferSizeMax = 0x1000000;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_allocateLargerBuffer = false;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_iteration = 0;
  this_00 = &(this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
             .m_iterationOrder;
  std::vector<int,_std::allocator<int>_>::vector(this_00,0x14,&local_3d);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar8 = (pointer)operator_new(0x460);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pUVar8;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar8 + 0x14;
  (pUVar8->duration).writeDuration = 0;
  (pUVar8->duration).totalDuration = 0;
  (pUVar8->duration).mapDuration = 0;
  (pUVar8->duration).unmapDuration = 0;
  pUVar8->bufferSize = 0;
  pUVar8->allocatedSize = 0;
  *(undefined8 *)&pUVar8->writtenSize = 0;
  (pUVar8->duration).fitResponseDuration = 0;
  for (lVar12 = 0x38; lVar12 != 0x460; lVar12 = lVar12 + 0x38) {
    puVar1 = (undefined8 *)((long)&pUVar8->bufferSize + lVar12);
    puVar1[6] = (pUVar8->duration).fitResponseDuration;
    uVar2 = *(undefined8 *)pUVar8;
    uVar3 = *(undefined8 *)&pUVar8->writtenSize;
    dVar4 = (pUVar8->duration).mapDuration;
    dVar5 = (pUVar8->duration).unmapDuration;
    dVar6 = (pUVar8->duration).totalDuration;
    puVar1[4] = (pUVar8->duration).writeDuration;
    puVar1[5] = dVar6;
    puVar1[2] = dVar4;
    puVar1[3] = dVar5;
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
  }
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar8 + 0x14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_useGL = true;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .m_bufferRandomizerTimer = 0;
  local_3c = bufferSizeMin;
  local_38 = bufferSizeMax;
  generateTwoPassRandomIterationOrder
            (this_00,(this->
                     super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                     ).
                     super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                     .m_numSamples);
  uVar11 = (this->
           super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
           ).
           super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
           .m_numSamples;
  local_34 = (float)(int)uVar11;
  bVar10 = (this->
           super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
           ).
           super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
           .m_allocateLargerBuffer;
  pUVar8 = (this->
           super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
           ).
           super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
           .m_results.
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = 0;
  uVar9 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar9 = uVar14;
  }
  iVar13 = 1;
  for (; uVar9 * 0x38 - uVar14 != 0; uVar14 = uVar14 + 0x38) {
    fVar15 = floorf(((float)iVar13 / local_34) * 16777216.0 + 0.0);
    uVar7 = (int)fVar15 + 0xfU & 0xfffffff0;
    uVar11 = (int)((float)(int)uVar7 * 1.5);
    if ((bVar10 & 1U) == 0) {
      uVar11 = uVar7;
    }
    *(uint *)((long)&pUVar8->bufferSize + uVar14) = uVar7;
    *(uint *)((long)&pUVar8->allocatedSize + uVar14) = uVar11 + 0xf & 0xfffffff0;
    *(undefined4 *)((long)&pUVar8->writtenSize + uVar14) = 0xffffffff;
    iVar13 = iVar13 + 1;
  }
  bVar10 = (bool)((byte)local_38 & 1);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).m_unmappingErrors = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).m_bufferUnspecifiedAfterTest = (bool)((byte)((usage & 8) >> 3) & bVar10);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).m_bufferUsage = local_3c;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ModifyAfterWithMapBufferRangeCase_01e42548;
  this->m_partialUpload = bVar10;
  this->m_mapFlags = usage;
  return;
}

Assistant:

ModifyAfterWithMapBufferRangeCase::ModifyAfterWithMapBufferRangeCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, deUint32 usage, int flags, deUint32 glMapFlags)
	: ModifyAfterBasicCase<MapBufferRangeDurationNoAlloc>	(context, name, desc, bufferSizeMin, bufferSizeMax, usage, isBufferUnspecifiedAfterUpload(flags, glMapFlags))
	, m_partialUpload										((flags & FLAG_PARTIAL) != 0)
	, m_mapFlags											(glMapFlags)
{
}